

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int nextScaffoldPart(XML_Parser parser)

{
  int iVar1;
  int iVar2;
  DTD *pDVar3;
  int *piVar4;
  CONTENT_SCAFFOLD *pCVar5;
  uint uVar6;
  
  pDVar3 = parser->m_dtd;
  if (pDVar3->scaffIndex == (int *)0x0) {
    piVar4 = (int *)(*(parser->m_mem).malloc_fcn)((ulong)parser->m_groupSize << 2);
    pDVar3->scaffIndex = piVar4;
    if (piVar4 == (int *)0x0) {
      return -1;
    }
    *piVar4 = 0;
  }
  uVar6 = pDVar3->scaffCount;
  pCVar5 = pDVar3->scaffold;
  if (pDVar3->scaffSize <= uVar6) {
    if (pCVar5 == (CONTENT_SCAFFOLD *)0x0) {
      pCVar5 = (CONTENT_SCAFFOLD *)(*(parser->m_mem).malloc_fcn)(0x400);
      if (pCVar5 == (CONTENT_SCAFFOLD *)0x0) {
        return -1;
      }
      uVar6 = 0x20;
    }
    else {
      pCVar5 = (CONTENT_SCAFFOLD *)
               (*(parser->m_mem).realloc_fcn)(pCVar5,(ulong)(pDVar3->scaffSize * 2) << 5);
      if (pCVar5 == (CONTENT_SCAFFOLD *)0x0) {
        return -1;
      }
      uVar6 = pDVar3->scaffSize * 2;
    }
    pDVar3->scaffSize = uVar6;
    pDVar3->scaffold = pCVar5;
    uVar6 = pDVar3->scaffCount;
  }
  pDVar3->scaffCount = uVar6 + 1;
  if ((long)pDVar3->scaffLevel != 0) {
    iVar1 = pDVar3->scaffIndex[(long)pDVar3->scaffLevel + -1];
    if ((long)pCVar5[iVar1].lastchild != 0) {
      pCVar5[pCVar5[iVar1].lastchild].nextsib = uVar6;
    }
    iVar2 = pCVar5[iVar1].childcnt;
    if (iVar2 == 0) {
      pCVar5[iVar1].firstchild = uVar6;
    }
    pCVar5[iVar1].lastchild = uVar6;
    pCVar5[iVar1].childcnt = iVar2 + 1;
  }
  pCVar5 = pCVar5 + (int)uVar6;
  pCVar5->firstchild = 0;
  pCVar5->lastchild = 0;
  *(undefined8 *)(&pCVar5->firstchild + 2) = 0;
  return uVar6;
}

Assistant:

static int FASTCALL
nextScaffoldPart(XML_Parser parser)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  CONTENT_SCAFFOLD * me;
  int next;

  if (!dtd->scaffIndex) {
    dtd->scaffIndex = (int *)MALLOC(parser, parser->m_groupSize * sizeof(int));
    if (!dtd->scaffIndex)
      return -1;
    dtd->scaffIndex[0] = 0;
  }

  if (dtd->scaffCount >= dtd->scaffSize) {
    CONTENT_SCAFFOLD *temp;
    if (dtd->scaffold) {
      temp = (CONTENT_SCAFFOLD *)
        REALLOC(parser, dtd->scaffold, dtd->scaffSize * 2 * sizeof(CONTENT_SCAFFOLD));
      if (temp == NULL)
        return -1;
      dtd->scaffSize *= 2;
    }
    else {
      temp = (CONTENT_SCAFFOLD *)MALLOC(parser, INIT_SCAFFOLD_ELEMENTS
                                        * sizeof(CONTENT_SCAFFOLD));
      if (temp == NULL)
        return -1;
      dtd->scaffSize = INIT_SCAFFOLD_ELEMENTS;
    }
    dtd->scaffold = temp;
  }
  next = dtd->scaffCount++;
  me = &dtd->scaffold[next];
  if (dtd->scaffLevel) {
    CONTENT_SCAFFOLD *parent = &dtd->scaffold[dtd->scaffIndex[dtd->scaffLevel-1]];
    if (parent->lastchild) {
      dtd->scaffold[parent->lastchild].nextsib = next;
    }
    if (!parent->childcnt)
      parent->firstchild = next;
    parent->lastchild = next;
    parent->childcnt++;
  }
  me->firstchild = me->lastchild = me->childcnt = me->nextsib = 0;
  return next;
}